

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVarSup.cpp
# Opt level: O1

ClauseIterator __thiscall Inferences::SubVarSup::generateClauses(SubVarSup *this,Clause *premise)

{
  long *plVar1;
  long *plVar2;
  Ordering *pOVar3;
  bool bVar4;
  bool bVar5;
  Clause *in_RDX;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  *i;
  CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
  *i_00;
  ForwardResultFn f;
  BackwardResultFn f_00;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  itb;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  itf;
  Value local_5c8;
  Value local_5b8;
  Value local_568;
  Value local_558;
  undefined1 local_548 [16];
  anon_class_8_1_54a39801_for__func local_538;
  ApplicableRewritesFn local_530;
  Clause *pCStack_528;
  Entry *local_520;
  Value VStack_518;
  bool local_510;
  Value local_508;
  char local_500;
  Value local_4f8;
  Value local_4f0;
  bool local_4e8;
  Value local_4e0;
  Value local_4d8;
  bool local_4d0;
  Value local_4c8;
  bool local_488;
  Value local_480;
  bool local_478;
  Value local_470;
  undefined1 local_468 [48];
  Value VStack_438;
  bool local_430;
  Value local_428;
  bool local_420;
  Value local_418;
  undefined1 local_410 [32];
  undefined1 local_3f0 [40];
  bool local_3c8;
  Value local_3c0;
  bool local_3a8;
  Value local_3a0;
  bool local_398;
  Value local_390;
  bool local_350;
  Value local_348;
  bool local_340;
  Value local_338;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>
  local_330;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  local_2d8;
  Clause *local_258;
  SubVarSup *pSStack_250;
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  local_248;
  RewriteableSubtermsFn local_1d0;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  local_1a0;
  IterTraits<Lib::FilteredIterator<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>,_Lib::NonzeroFn,_false>_>
  local_120;
  
  local_2d8._iter._inner._master._func._index._0_4_ = *(uint *)&in_RDX->field_0x3c & 0xfffff;
  local_2d8._iter._func._parent = (SubVarSup *)0x0;
  RewriteableSubtermsFn::RewriteableSubtermsFn
            (&local_1d0,*(Ordering **)(*(long *)&(premise->super_Unit)._inference + 0xb8),in_RDX);
  ::Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
  ::flatMap<Inferences::SubVarSup::RewriteableSubtermsFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_410,
             (IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
              *)&local_2d8,&local_1d0);
  ::Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  ::flatMap<Inferences::SubVarSup::ApplicableRewritesFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_548,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_410,(SubVarSupLHSIndex *)(premise->super_Unit)._inference._splits);
  f._parent = (SubVarSup *)premise;
  f._cl = in_RDX;
  ::Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::map<Inferences::SubVarSup::ForwardResultFn>
            (&local_1a0,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_548,f);
  if ((local_4e8 == true) &&
     (plVar2 = (long *)CONCAT71(local_4e0._1_7_,local_4e0._0_1_), plVar2 != (long *)0x0)) {
    plVar1 = plVar2 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (((bool)local_4f8._0_1_ == true) && (local_4f0 != (Value)0x0)) {
    plVar2 = (long *)((long)local_4f0 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_4f0 + 8))();
    }
  }
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             (local_548 + 8));
  if ((local_3c8 == true) && (local_3c0 != (Value)0x0)) {
    plVar2 = (long *)((long)local_3c0 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_3c0 + 8))();
    }
  }
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)local_410
            );
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &local_1d0);
  local_2d8._iter._inner._master._func._index._0_4_ = *(uint *)&in_RDX->field_0x3c & 0xfffff;
  local_2d8._iter._func._parent = (SubVarSup *)0x0;
  ::Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
  ::flatMap<Kernel::EqHelper::SubVarSupLHSIteratorFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_410,
             (IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
              *)&local_2d8,*(Ordering **)(*(long *)&(premise->super_Unit)._inference + 0xb8));
  ::Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  ::flatMap<Inferences::SubVarSup::RewritableResultsFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_548,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_410,*(SubVarSupSubtermIndex **)&(premise->super_Unit)._inference.field_0x8);
  f_00._parent = (SubVarSup *)premise;
  f_00._cl = in_RDX;
  ::Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::map<Inferences::SubVarSup::BackwardResultFn>
            ((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
              *)local_468,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_548,f_00);
  if ((local_510 == true) && (local_508 != (Value)0x0)) {
    plVar2 = (long *)((long)local_508 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_508 + 8))();
    }
  }
  if ((local_520._0_1_ == true) && (VStack_518 != (Value)0x0)) {
    pOVar3 = (Ordering *)((long)VStack_518 + 8);
    *(int *)&pOVar3->_vptr_Ordering = *(int *)&pOVar3->_vptr_Ordering + -1;
    if (*(int *)&pOVar3->_vptr_Ordering == 0) {
      (*(*(_func_int ***)VStack_518)[1])();
    }
  }
  if ((local_3f0[0] == true) && ((Value)local_3f0._8_8_ != (Value)0x0)) {
    pOVar3 = (Ordering *)(local_3f0._8_8_ + 8);
    *(int *)&pOVar3->_vptr_Ordering = *(int *)&pOVar3->_vptr_Ordering + -1;
    if (*(int *)&pOVar3->_vptr_Ordering == 0) {
      (*(*(_func_int ***)local_3f0._8_8_)[1])();
    }
  }
  local_258 = local_1a0._iter._func._cl;
  pSStack_250 = local_1a0._iter._func._parent;
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator(&local_248,&local_1a0._iter._inner);
  bVar5 = local_420;
  bVar4 = local_430;
  if (local_430 == true) {
    local_568 = local_428;
    if (local_428 != (Value)0x0) {
      *(int *)((long)local_428 + 8) = *(int *)((long)local_428 + 8) + 1;
    }
  }
  if (local_420 == true) {
    local_558 = local_418;
    if (local_418 != (Value)0x0) {
      *(int *)((long)local_418 + 8) = *(int *)((long)local_418 + 8) + 1;
    }
  }
  local_2d8._iter._func._cl = local_258;
  local_2d8._iter._func._parent = pSStack_250;
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator(&local_2d8._iter._inner,&local_248);
  if (bVar4 == true) {
    local_5c8 = local_568;
    if (local_568 != (Value)0x0) {
      *(int *)((long)local_568 + 8) = *(int *)((long)local_568 + 8) + 1;
    }
  }
  if (bVar5 == true) {
    local_5b8 = local_558;
    if (local_558 != (Value)0x0) {
      *(int *)((long)local_558 + 8) = *(int *)((long)local_558 + 8) + 1;
    }
  }
  local_548._0_8_ = local_468._0_8_;
  local_548._8_8_ = local_468._8_8_;
  local_538.a = (Clause *)local_468._16_8_;
  local_530._index = (SubVarSupLHSIndex *)local_468._24_8_;
  pCStack_528 = (Clause *)local_468._32_8_;
  local_520 = (Entry *)local_468._40_8_;
  VStack_518 = VStack_438;
  local_510 = bVar4;
  if (bVar4 == true) {
    local_508 = local_5c8;
    if (local_5c8 != (Value)0x0) {
      *(int *)((long)local_5c8 + 8) = *(int *)((long)local_5c8 + 8) + 1;
    }
  }
  local_500 = bVar5;
  if (bVar5 == true) {
    local_4f8 = local_5b8;
    if (local_5b8 != (Value)0x0) {
      *(int *)((long)local_5b8 + 8) = *(int *)((long)local_5b8 + 8) + 1;
    }
  }
  ::Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>
            (&local_330,(Lib *)local_548,i);
  if ((local_500 == '\x01') && (local_4f8 != (Value)0x0)) {
    plVar2 = (long *)((long)local_4f8 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_4f8 + 8))();
    }
  }
  if ((local_510 == true) && (local_508 != (Value)0x0)) {
    plVar2 = (long *)((long)local_508 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_508 + 8))();
    }
  }
  ::Lib::
  CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
  ::CatIterator((CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
                 *)local_548,&local_2d8,&local_330);
  ::Lib::
  iterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::SubVarSup::RewriteableSubtermsFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::ApplicableRewritesFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::ForwardResultFn,Kernel::Clause*>>,Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>>>
            ((IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
              *)local_410,(Lib *)local_548,i_00);
  if ((local_478 == true) && (local_470 != (Value)0x0)) {
    plVar2 = (long *)((long)local_470 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_470 + 8))();
    }
  }
  if ((local_488 == true) && (local_480 != (Value)0x0)) {
    plVar2 = (long *)((long)local_480 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_480 + 8))();
    }
  }
  if ((local_4d0 == true) && (local_4c8 != (Value)0x0)) {
    plVar2 = (long *)((long)local_4c8 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_4c8 + 8))();
    }
  }
  if ((local_4e0._0_1_ == '\x01') && (local_4d8 != (Value)0x0)) {
    plVar2 = (long *)((long)local_4d8 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_4d8 + 8))();
    }
  }
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &pCStack_528);
  if ((local_330._iter._iter._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_330._iter._iter._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_330._iter._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_330._iter._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_330._iter._iter._inner._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_330._iter._iter._inner._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_330._iter._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_330._iter._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((bVar5 == true) && (local_5b8 != (Value)0x0)) {
    plVar2 = (long *)((long)local_5b8 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_5b8 + 8))();
    }
  }
  if ((bVar4 == true) && (local_5c8 != (Value)0x0)) {
    plVar2 = (long *)((long)local_5c8 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_5c8 + 8))();
    }
  }
  if ((local_2d8._iter._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_2d8._iter._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_2d8._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_2d8._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_2d8._iter._inner._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_2d8._iter._inner._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_2d8._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_2d8._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &local_2d8._iter._inner._master._inner);
  ::Lib::
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
  ::filter<Lib::NonzeroFn>
            (&local_120,
             (IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
              *)local_410);
  ::Lib::
  pvi<Lib::IterTraits<Lib::FilteredIterator<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::SubVarSup::RewriteableSubtermsFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::ApplicableRewritesFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::ForwardResultFn,Kernel::Clause*>>,Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>>,Lib::NonzeroFn,false>>>
            ((Lib *)this,&local_120);
  if ((local_120._iter._inn._it2._iter._iter._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_120._iter._inn._it2._iter._iter._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_120._iter._inn._it2._iter._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_120._iter._inn._it2._iter._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_120._iter._inn._it2._iter._iter._inner._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_120._iter._inn._it2._iter._iter._inner._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_120._iter._inn._it2._iter._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_120._iter._inn._it2._iter._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_120._iter._inn._it1._iter._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_120._iter._inn._it1._iter._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_120._iter._inn._it1._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_120._iter._inn._it1._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_120._iter._inn._it1._iter._inner._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_120._iter._inn._it1._iter._inner._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_120._iter._inn._it1._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_120._iter._inn._it1._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &local_120._iter._inn._it1._iter._inner._master._inner);
  if ((local_340 == true) && (local_338 != (Value)0x0)) {
    plVar2 = (long *)((long)local_338 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_338 + 8))();
    }
  }
  if ((local_350 == true) && (local_348 != (Value)0x0)) {
    plVar2 = (long *)((long)local_348 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_348 + 8))();
    }
  }
  if ((local_398 == true) && (local_390 != (Value)0x0)) {
    plVar2 = (long *)((long)local_390 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_390 + 8))();
    }
  }
  if ((local_3a8 == true) && (local_3a0 != (Value)0x0)) {
    plVar2 = (long *)((long)local_3a0 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_3a0 + 8))();
    }
  }
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)local_3f0
            );
  if ((bVar5 == true) && (local_558 != (Value)0x0)) {
    plVar2 = (long *)((long)local_558 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_558 + 8))();
    }
  }
  if ((bVar4 == true) && (local_568 != (Value)0x0)) {
    plVar2 = (long *)((long)local_568 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_568 + 8))();
    }
  }
  if ((local_248._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_248._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_248._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_248._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_248._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_248._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_248._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_248._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &local_248._master._inner);
  if ((local_420 == true) && (local_418 != (Value)0x0)) {
    plVar2 = (long *)((long)local_418 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_418 + 8))();
    }
  }
  if ((local_430 == true) && (local_428 != (Value)0x0)) {
    plVar2 = (long *)((long)local_428 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_428 + 8))();
    }
  }
  if ((local_1a0._iter._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_1a0._iter._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_1a0._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_1a0._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_1a0._iter._inner._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_1a0._iter._inner._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_1a0._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_1a0._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &local_1a0._iter._inner._master._inner);
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator SubVarSup::generateClauses(Clause* premise)
{
  //cout << "SubVarSup with " << premise->toString() << endl;

  auto itf = iterTraits(premise->getSelectedLiteralIterator())
  // Get an iterator of pairs of selected literals and rewritable subterms of those literals
  // A subterm is rewritable (see EqHelper) if
  //  a) The literal is a positive equality t1=t2 and the subterm is max(t1,t2) wrt ordering
  //  b) The subterm is not a variable
     .flatMap(RewriteableSubtermsFn(_salg->getOrdering(), premise))

  // Get clauses with a literal whose complement unifies with the rewritable subterm,
  // returns a pair with the original pair and the unification result (includes substitution)
     .flatMap(ApplicableRewritesFn(_lhsIndex))

  //Perform forward SubVarSup
     .map(ForwardResultFn(premise, *this));

  auto itb = iterTraits(premise->getSelectedLiteralIterator())
             .flatMap(EqHelper::SubVarSupLHSIteratorFn(_salg->getOrdering()))
             .flatMap(RewritableResultsFn(_subtermIndex))
  //Perform backward SubVarSup
             .map(BackwardResultFn(premise, *this));

  // Add the results of forward and backward together
  return pvi(concatIters(std::move(itf),std::move(itb))
  // Remove null elements - these can come from performSubVarSup
          .filter(NonzeroFn()));
}